

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::ShaderMatrixTests::init(ShaderMatrixTests *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  MatrixOp op;
  InputType IVar2;
  DataType dataType;
  Precision precision;
  Context *pCVar3;
  int vecSize;
  DataType dataType_00;
  TestNode *node;
  char *__rhs;
  ShaderMatrixCase *pSVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  InputTypeSpec *pIVar9;
  long lVar10;
  long lVar11;
  string *this_00;
  string vecMatName;
  ShaderInput matIn;
  ShaderInput scalarIn;
  allocator<char> local_159;
  DataType local_158;
  InputType local_154;
  char *local_150;
  ShaderInput vecIn;
  string baseName;
  ShaderInput otherMatIn;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar8 = 0;
  do {
    if (lVar8 == 0xf) {
      return 0xf;
    }
    bVar1 = init::ops[lVar8].extendedInputTypeCases;
    pIVar9 = init::reducedInputTypes;
    if (bVar1 != false) {
      pIVar9 = init::extendedInputTypes;
    }
    op = init::ops[lVar8].op;
    node = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::ops[lVar8].name,init::ops[lVar8].desc);
    tcu::TestNode::addChild((TestNode *)this,node);
    for (lVar7 = 0; lVar7 != (ulong)bVar1 * 2 + 1; lVar7 = lVar7 + 1) {
      IVar2 = pIVar9[lVar7].type;
      local_154 = IVar2;
      if (IVar2 == INPUTTYPE_DYNAMIC) {
        local_154 = INPUTTYPE_UNIFORM;
      }
      for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
        dataType = init::matrixTypes[lVar11];
        local_150 = glu::getDataTypeName(dataType);
        for (lVar10 = 0; lVar10 != 0xc; lVar10 = lVar10 + 4) {
          precision = *(Precision *)((long)init::precisions + lVar10);
          __rhs = glu::getPrecisionName(precision);
          pcVar6 = pIVar9[lVar7].name;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b0,pcVar6,(allocator<char> *)&local_50);
          std::operator+(&local_90,&local_b0,"_");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &otherMatIn,&local_90,__rhs);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &scalarIn,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &otherMatIn,"_");
          std::operator+(&vecMatName,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &scalarIn,local_150);
          std::operator+(&baseName,&vecMatName,"_");
          std::__cxx11::string::~string((string *)&vecMatName);
          std::__cxx11::string::~string((string *)&scalarIn);
          std::__cxx11::string::~string((string *)&otherMatIn);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_b0);
          matIn.inputType = IVar2;
          matIn.dataType = dataType;
          matIn.precision = precision;
          if (op < OP_COMP_MUL) {
            scalarIn.dataType = TYPE_FLOAT;
            scalarIn.inputType = (op != OP_DIV) + INPUTTYPE_UNIFORM;
            scalarIn.precision = precision;
            pSVar4 = (ShaderMatrixCase *)operator_new(0x148);
            pCVar3 = (this->super_TestCaseGroup).m_context;
            std::operator+(&vecMatName,&baseName,"float_vertex");
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar4,pCVar3,vecMatName._M_dataplus._M_p,"Matrix-scalar case",&matIn,
                       &scalarIn,op,true);
            tcu::TestNode::addChild(node,(TestNode *)pSVar4);
            std::__cxx11::string::~string((string *)&vecMatName);
            pSVar4 = (ShaderMatrixCase *)operator_new(0x148);
            pCVar3 = (this->super_TestCaseGroup).m_context;
            std::operator+(&vecMatName,&baseName,"float_fragment");
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar4,pCVar3,vecMatName._M_dataplus._M_p,"Matrix-scalar case",&matIn,
                       &scalarIn,op,false);
            tcu::TestNode::addChild(node,(TestNode *)pSVar4);
            std::__cxx11::string::~string((string *)&vecMatName);
            if (op == OP_MUL) {
              vecSize = glu::getDataTypeMatrixNumColumns(dataType);
              dataType_00 = glu::getDataTypeFloatVec(vecSize);
              vecIn.inputType = INPUTTYPE_DYNAMIC;
              vecIn.dataType = dataType_00;
              vecIn.precision = precision;
              pSVar4 = (ShaderMatrixCase *)operator_new(0x148);
              pCVar3 = (this->super_TestCaseGroup).m_context;
              local_158 = dataType_00;
              pcVar5 = glu::getDataTypeName(dataType_00);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &scalarIn,&baseName,pcVar5);
              std::operator+(&vecMatName,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &scalarIn,"_vertex");
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar4,pCVar3,vecMatName._M_dataplus._M_p,"Matrix-vector case",&matIn,
                         &vecIn,OP_MUL,true);
              tcu::TestNode::addChild(node,(TestNode *)pSVar4);
              std::__cxx11::string::~string((string *)&vecMatName);
              std::__cxx11::string::~string((string *)&scalarIn);
              pSVar4 = (ShaderMatrixCase *)operator_new(0x148);
              pCVar3 = (this->super_TestCaseGroup).m_context;
              pcVar5 = glu::getDataTypeName(local_158);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &scalarIn,&baseName,pcVar5);
              std::operator+(&vecMatName,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &scalarIn,"_fragment");
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar4,pCVar3,vecMatName._M_dataplus._M_p,"Matrix-vector case",&matIn,
                         &vecIn,OP_MUL,false);
              tcu::TestNode::addChild(node,(TestNode *)pSVar4);
              std::__cxx11::string::~string((string *)&vecMatName);
              std::__cxx11::string::~string((string *)&scalarIn);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_70,pcVar6,&local_159);
              std::operator+(&local_50,&local_70,"_");
              std::operator+(&local_b0,&local_50,__rhs);
              std::operator+(&local_90,&local_b0,"_");
              pcVar6 = glu::getDataTypeName(local_158);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &otherMatIn,&local_90,pcVar6);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &scalarIn,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &otherMatIn,"_");
              std::operator+(&vecMatName,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &scalarIn,local_150);
              std::__cxx11::string::~string((string *)&scalarIn);
              std::__cxx11::string::~string((string *)&otherMatIn);
              std::__cxx11::string::~string((string *)&local_90);
              std::__cxx11::string::~string((string *)&local_b0);
              std::__cxx11::string::~string((string *)&local_50);
              std::__cxx11::string::~string((string *)&local_70);
              pSVar4 = (ShaderMatrixCase *)operator_new(0x148);
              pCVar3 = (this->super_TestCaseGroup).m_context;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &scalarIn,&vecMatName,"_vertex");
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar4,pCVar3,(char *)scalarIn._0_8_,"Vector-matrix case",&vecIn,&matIn,
                         OP_MUL,true);
              tcu::TestNode::addChild(node,(TestNode *)pSVar4);
              std::__cxx11::string::~string((string *)&scalarIn);
              pSVar4 = (ShaderMatrixCase *)operator_new(0x148);
              pCVar3 = (this->super_TestCaseGroup).m_context;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &scalarIn,&vecMatName,"_fragment");
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar4,pCVar3,(char *)scalarIn._0_8_,"Vector-matrix case",&vecIn,&matIn,
                         OP_MUL,false);
              tcu::TestNode::addChild(node,(TestNode *)pSVar4);
              std::__cxx11::string::~string((string *)&scalarIn);
              std::__cxx11::string::~string((string *)&vecMatName);
            }
LAB_00e6fb49:
            otherMatIn.inputType = local_154;
            otherMatIn.dataType = dataType;
            otherMatIn.precision = precision;
            pSVar4 = (ShaderMatrixCase *)operator_new(0x148);
            pCVar3 = (this->super_TestCaseGroup).m_context;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &scalarIn,&baseName,local_150);
            std::operator+(&vecMatName,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &scalarIn,"_vertex");
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar4,pCVar3,vecMatName._M_dataplus._M_p,"Matrix-matrix case",&matIn,
                       &otherMatIn,op,true);
            tcu::TestNode::addChild(node,(TestNode *)pSVar4);
            std::__cxx11::string::~string((string *)&vecMatName);
            std::__cxx11::string::~string((string *)&scalarIn);
            pSVar4 = (ShaderMatrixCase *)operator_new(0x148);
            pCVar3 = (this->super_TestCaseGroup).m_context;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &scalarIn,&baseName,local_150);
            std::operator+(&vecMatName,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &scalarIn,"_fragment");
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar4,pCVar3,vecMatName._M_dataplus._M_p,"Matrix-matrix case",&matIn,
                       &otherMatIn,op,false);
            tcu::TestNode::addChild(node,(TestNode *)pSVar4);
            std::__cxx11::string::~string((string *)&vecMatName);
            this_00 = (string *)&scalarIn;
LAB_00e6fe95:
            std::__cxx11::string::~string((string *)this_00);
          }
          else {
            if (op == OP_COMP_MUL) goto LAB_00e6fb49;
            if (op - OP_UNARY_PLUS < 6) {
              scalarIn.inputType = INPUTTYPE_LAST;
              scalarIn.dataType = TYPE_LAST;
              scalarIn.precision = PRECISION_LAST;
              pSVar4 = (ShaderMatrixCase *)operator_new(0x148);
              pCVar3 = (this->super_TestCaseGroup).m_context;
              std::operator+(&vecMatName,&baseName,"vertex");
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar4,pCVar3,vecMatName._M_dataplus._M_p,"Matrix case",&matIn,&scalarIn,op
                         ,true);
              tcu::TestNode::addChild(node,(TestNode *)pSVar4);
              std::__cxx11::string::~string((string *)&vecMatName);
              pSVar4 = (ShaderMatrixCase *)operator_new(0x148);
              pCVar3 = (this->super_TestCaseGroup).m_context;
              std::operator+(&vecMatName,&baseName,"fragment");
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar4,pCVar3,vecMatName._M_dataplus._M_p,"Matrix case",&matIn,&scalarIn,op
                         ,false);
              tcu::TestNode::addChild(node,(TestNode *)pSVar4);
LAB_00e6fe92:
              this_00 = &vecMatName;
              goto LAB_00e6fe95;
            }
            if (op - OP_ADD_INTO < 4) {
              scalarIn.dataType = dataType;
              scalarIn.inputType = local_154;
              scalarIn.precision = precision;
              pSVar4 = (ShaderMatrixCase *)operator_new(0x148);
              pCVar3 = (this->super_TestCaseGroup).m_context;
              std::operator+(&vecMatName,&baseName,"vertex");
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar4,pCVar3,vecMatName._M_dataplus._M_p,"Matrix assignment case",&matIn,
                         &scalarIn,op,true);
              tcu::TestNode::addChild(node,(TestNode *)pSVar4);
              std::__cxx11::string::~string((string *)&vecMatName);
              pSVar4 = (ShaderMatrixCase *)operator_new(0x148);
              pCVar3 = (this->super_TestCaseGroup).m_context;
              std::operator+(&vecMatName,&baseName,"fragment");
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar4,pCVar3,vecMatName._M_dataplus._M_p,"Matrix assignment case",&matIn,
                         &scalarIn,op,false);
              tcu::TestNode::addChild(node,(TestNode *)pSVar4);
              goto LAB_00e6fe92;
            }
          }
          std::__cxx11::string::~string((string *)&baseName);
        }
      }
    }
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

void ShaderMatrixTests::init (void)
{
	static const struct
	{
		const char*		name;
		const char*		desc;
		MatrixOp		op;
		bool			extendedInputTypeCases; // !< test with const and uniform types too
	} ops[] =
	{
		{ "add",			"Matrix addition tests",						OP_ADD,				true	},
		{ "sub",			"Matrix subtraction tests",						OP_SUB,				true	},
		{ "mul",			"Matrix multiplication tests",					OP_MUL,				true	},
		{ "div",			"Matrix division tests",						OP_DIV,				true	},
		{ "matrixcompmult",	"Matrix component-wise multiplication tests",	OP_COMP_MUL,		false	},
		{ "unary_addition",	"Matrix unary addition tests",					OP_UNARY_PLUS,		false	},
		{ "negation",		"Matrix negation tests",						OP_NEGATION,		false	},
		{ "pre_increment",	"Matrix prefix increment tests",				OP_PRE_INCREMENT,	false	},
		{ "pre_decrement",	"Matrix prefix decrement tests",				OP_PRE_DECREMENT,	false	},
		{ "post_increment",	"Matrix postfix increment tests",				OP_POST_INCREMENT,	false	},
		{ "post_decrement",	"Matrix postfix decrement tests",				OP_POST_DECREMENT,	false	},
		{ "add_assign",		"Matrix add into tests",						OP_ADD_INTO,		false	},
		{ "sub_assign",		"Matrix subtract from tests",					OP_SUBTRACT_FROM,	false	},
		{ "mul_assign",		"Matrix multiply into tests",					OP_MULTIPLY_INTO,	false	},
		{ "div_assign",		"Matrix divide into tests",						OP_DIVIDE_INTO,		false	},
	};

	struct InputTypeSpec
	{
		const char*		name;
		const char*		desc;
		InputType		type;
	};
	static const InputTypeSpec extendedInputTypes[] =
	{
		{ "const",		"Constant matrix input",	INPUTTYPE_CONST		},
		{ "uniform",	"Uniform matrix input",		INPUTTYPE_UNIFORM	},
		{ "dynamic",	"Dynamic matrix input",		INPUTTYPE_DYNAMIC	}
	};
	static const InputTypeSpec reducedInputTypes[] =
	{
		{ "dynamic",	"Dynamic matrix input",		INPUTTYPE_DYNAMIC	}
	};

	static const DataType matrixTypes[] =
	{
		TYPE_FLOAT_MAT2,
		TYPE_FLOAT_MAT3,
		TYPE_FLOAT_MAT4
	};

	static const Precision precisions[] =
	{
		PRECISION_LOWP,
		PRECISION_MEDIUMP,
		PRECISION_HIGHP
	};

	for (int opNdx = 0; opNdx < DE_LENGTH_OF_ARRAY(ops); opNdx++)
	{
		const InputTypeSpec*	inTypeList		= (ops[opNdx].extendedInputTypeCases) ? (extendedInputTypes) : (reducedInputTypes);
		const int				inTypeListSize	= (ops[opNdx].extendedInputTypeCases) ? (DE_LENGTH_OF_ARRAY(extendedInputTypes)) : (DE_LENGTH_OF_ARRAY(reducedInputTypes));
		const MatrixOp			op				= ops[opNdx].op;
		tcu::TestCaseGroup*		opGroup			= new tcu::TestCaseGroup(m_testCtx, ops[opNdx].name, ops[opNdx].desc);

		addChild(opGroup);

		for (int inTypeNdx = 0; inTypeNdx < inTypeListSize; inTypeNdx++)
		{
			const InputType		inputType	= inTypeList[inTypeNdx].type;

			for (int matTypeNdx = 0; matTypeNdx < DE_LENGTH_OF_ARRAY(matrixTypes); matTypeNdx++)
			{
				DataType	matType		= matrixTypes[matTypeNdx];
				const char*	matTypeName	= getDataTypeName(matType);

				for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
				{
					Precision	precision	= precisions[precNdx];
					const char*	precName	= getPrecisionName(precision);
					string		baseName	= string(inTypeList[inTypeNdx].name) + "_" + precName + "_" + matTypeName + "_";
					ShaderInput	matIn		(inputType, matType, precision);

					if (isOperationMatrixScalar(op))
					{
						// Matrix-scalar \note For div cases we use uniform input.
						ShaderInput scalarIn(op == OP_DIV ? INPUTTYPE_UNIFORM : INPUTTYPE_DYNAMIC, TYPE_FLOAT, precision);
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_vertex").c_str(),		"Matrix-scalar case", matIn, scalarIn, op, true));
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_fragment").c_str(),	"Matrix-scalar case", matIn, scalarIn, op, false));
					}

					if (isOperationMatrixVector(op))
					{
						// Matrix-vector.
						DataType	vecType	= getDataTypeFloatVec(getDataTypeMatrixNumColumns(matType));
						ShaderInput vecIn	(op == OP_DIV ? INPUTTYPE_UNIFORM : INPUTTYPE_DYNAMIC, vecType, precision);

						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + getDataTypeName(vecType) + "_vertex").c_str(),	"Matrix-vector case", matIn, vecIn, op, true));
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + getDataTypeName(vecType) + "_fragment").c_str(),	"Matrix-vector case", matIn, vecIn, op, false));

						// Vector-matrix.
						string vecMatName = string(inTypeList[inTypeNdx].name) + "_" + precName + "_" + getDataTypeName(vecType) + "_" + matTypeName;
						opGroup->addChild(new ShaderMatrixCase(m_context, (vecMatName + "_vertex").c_str(),		"Vector-matrix case", vecIn, matIn, op, true));
						opGroup->addChild(new ShaderMatrixCase(m_context, (vecMatName + "_fragment").c_str(),	"Vector-matrix case", vecIn, matIn, op, false));
					}

					if (isOperationMatrixMatrix(op))
					{
						// Matrix-matrix.
						ShaderInput otherMatIn(inputType == INPUTTYPE_DYNAMIC ? INPUTTYPE_UNIFORM : inputType, matType, precision);
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + matTypeName + "_vertex").c_str(),		"Matrix-matrix case", matIn, otherMatIn, op, true));
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + matTypeName + "_fragment").c_str(),	"Matrix-matrix case", matIn, otherMatIn, op, false));
					}

					if (isOperationUnary(op))
					{
						// op matrix
						ShaderInput voidInput(INPUTTYPE_LAST, TYPE_LAST, PRECISION_LAST);
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "vertex").c_str(),		"Matrix case", matIn, voidInput, op, true));
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "fragment").c_str(),	"Matrix case", matIn, voidInput, op, false));
					}

					if (isOperationAssignment(op))
					{
						ShaderInput otherMatIn(inputType == INPUTTYPE_DYNAMIC ? INPUTTYPE_UNIFORM : inputType, matType, precision);
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "vertex").c_str(),		"Matrix assignment case", matIn, otherMatIn, op, true));
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "fragment").c_str(),	"Matrix assignment case", matIn, otherMatIn, op, false));
					}
				}
			}
		}
	}
}